

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_bool_combined(void)

{
  int iVar1;
  char *pcVar2;
  uint c;
  uint b;
  cargo_t cargo;
  uint a;
  char *args [3];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    a = 0;
    b = 0;
    c = 0;
    args[2] = "123";
    args[0]._0_4_ = 0x127be1;
    args[0]._4_4_ = 0;
    args[1]._0_4_ = 0x12753b;
    args[1]._4_4_ = 0;
    iVar1 = cargo_add_option(cargo,0,"--alpha -a",(char *)0x0,"b");
    pcVar2 = "Failed to add option";
    if (((iVar1 == 0) &&
        (iVar1 = cargo_add_option(cargo,0,"--beta -b",(char *)0x0,"b",&b), iVar1 == 0)) &&
       (iVar1 = cargo_add_option(cargo,0,"--centauri -c",(char *)0x0,"b",&c), iVar1 == 0)) {
      iVar1 = cargo_parse(cargo,0,1,3,args);
      if (iVar1 == 0) {
        printf("a = Expect: %u Got: %u\n",1,(ulong)a);
        if (a == 1) {
          printf("b = Expect: %u Got: %u\n",1,(ulong)b);
          if (b == 1) {
            pcVar2 = (char *)0x0;
            printf("c = Expect: %u Got: %u\n",1,(ulong)c);
            if (c != 1) {
              pcVar2 = "Expected c == 1";
            }
          }
          else {
            pcVar2 = "Expected b == 1";
          }
        }
        else {
          pcVar2 = "Expected a == 1";
        }
      }
      else {
        pcVar2 = "Parse failed";
      }
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_bool_combined)
{
    unsigned int a = 0;
    unsigned int b = 0;
    unsigned int c = 0;
    char *args[] = { "program", "-abc", "123"};

    ret = cargo_add_option(cargo, 0, "--alpha -a", NULL, "b", &a);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_add_option(cargo, 0, "--beta -b", NULL, "b", &b);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_add_option(cargo, 0, "--centauri -c", NULL, "b", &c);
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed");

    printf("a = Expect: %u Got: %u\n", 1, a);
    cargo_assert(a == 1, "Expected a == 1");

    printf("b = Expect: %u Got: %u\n", 1, b);
    cargo_assert(b == 1, "Expected b == 1");

    printf("c = Expect: %u Got: %u\n", 1, c);
    cargo_assert(c == 1, "Expected c == 1");

    _TEST_CLEANUP();
}